

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nagel.c
# Opt level: O0

float dt(qnode_ptr_t c,qnode_ptr_t q,int x,int y)

{
  int iVar1;
  int h;
  int k;
  int i;
  float d;
  int y_local;
  int x_local;
  qnode_ptr_t q_local;
  qnode_ptr_t c_local;
  
  iVar1 = C.m / 2;
  k = 0;
  for (h = -iVar1; h <= iVar1; h = h + 1) {
    k = (int)((*c->gauss_ptr[h + iVar1])[c->res * x + y] * C.k[h + iVar1] + (float)k);
  }
  return (float)k / C.f;
}

Assistant:

float dt(c,q,x,y)
qnode_ptr_t c, q ;
int x, y ;

{ extern kernel_t C ;
  float d ;
  int i, k, h ;

  h = C.m/2 ;
  k = c->sizz/2 ;

  d = 0.0 ;
 for (i = -h ; i <= h ; i++) {
    d += (*c->gauss_ptr[i+h])[c->res*x + y]*C.k[i+h] ;
  }
  d /= C.f ;
  return(d) ;
}